

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeNF
          (ChElementShellANCF_3833 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double *pdVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  void *pvVar22;
  ulong uVar23;
  undefined8 *puVar24;
  double *pdVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_A;
  ChMatrix33<double> J_Cxi_Inv;
  VectorN G_B;
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  MatrixNx3 QiCompact;
  MatrixNx3c Sxi_D;
  Matrix<double,_3,_3,_1,_3,_3> local_b40;
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  Matrix<double,_3,_3,_1,_3,_3> local_910;
  assign_op<double,_double> local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  VectorN local_800;
  Matrix3xN local_740;
  Matrix<double,_24,_3,_1,_24,_3> local_500;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  Calc_Sxi_compact(this,&local_800,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  dVar10 = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
  if (2 < (long)dVar10) {
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [1] = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [2] = 1.48219693752374e-323;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [5] = 0.0;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [0] = (double)&local_800;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [4] = (double)F;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [7] = dVar10;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,3,1,24,3>,Eigen::Product<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
              (&local_500,
               (Product<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
                *)&local_740);
    pdVar25 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x48) {
      if (pdVar25 != (double *)0x0) {
        free((void *)pdVar25[-1]);
      }
      pvVar22 = malloc(0x280);
      if (pvVar22 == (void *)0x0) {
        puVar24 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar24 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar24,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)(((ulong)pvVar22 & 0xffffffffffffffc0) + 0x38) = pvVar22;
      pdVar25 = (double *)(((ulong)pvVar22 & 0xffffffffffffffc0) + 0x40);
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar25;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x48;
    }
    uVar23 = 0xfffffffffffffff8;
    do {
      dVar10 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
               m_data.array[uVar23 + 9];
      dVar1 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar23 + 10];
      dVar2 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar23 + 0xb];
      dVar15 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
               m_data.array[uVar23 + 0xc];
      dVar16 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
               m_data.array[uVar23 + 0xd];
      dVar17 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
               m_data.array[uVar23 + 0xe];
      dVar18 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
               m_data.array[uVar23 + 0xf];
      pdVar11 = pdVar25 + uVar23 + 8;
      *pdVar11 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
                 m_data.array[uVar23 + 8];
      pdVar11[1] = dVar10;
      pdVar11[2] = dVar1;
      pdVar11[3] = dVar2;
      pdVar11[4] = dVar15;
      pdVar11[5] = dVar16;
      pdVar11[6] = dVar17;
      pdVar11[7] = dVar18;
      uVar23 = uVar23 + 8;
    } while (uVar23 < 0x40);
    CalcCoordMatrix(this,&local_740);
    Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_a00._0_8_ = (XprTypeNested)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
              (&local_b40,&local_740,(MatrixNx3c *)local_2c0,(Scalar *)local_a00);
    local_a00._0_8_ = &local_b40;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_910,(SrcXprType *)local_a00,local_8c0);
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar31 = vbroadcastsd_avx512f(auVar29);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar32 = vbroadcastsd_avx512f(auVar28);
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar33 = vbroadcastsd_avx512f(auVar30);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[4];
    auVar34 = vbroadcastsd_avx512f(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
    auVar35 = vbroadcastsd_avx512f(auVar4);
    auVar36 = vmulpd_avx512f(auVar31,local_2c0);
    auVar37 = vmulpd_avx512f(auVar32,local_200);
    auVar38 = vmulpd_avx512f(auVar33,local_140);
    auVar39 = vmulpd_avx512f(auVar32,local_1c0);
    auVar40 = vmulpd_avx512f(auVar33,local_100);
    auVar32 = vmulpd_avx512f(auVar32,local_180);
    auVar33 = vmulpd_avx512f(auVar33,local_c0);
    auVar41 = vmulpd_avx512f(local_200,auVar34);
    auVar42 = vmulpd_avx512f(local_140,auVar35);
    auVar36 = vaddpd_avx512f(auVar36,auVar37);
    local_a00 = vaddpd_avx512f(auVar36,auVar38);
    auVar36 = vmulpd_avx512f(auVar31,local_280);
    auVar31 = vmulpd_avx512f(auVar31,local_240);
    auVar36 = vaddpd_avx512f(auVar36,auVar39);
    auVar31 = vaddpd_avx512f(auVar31,auVar32);
    local_9c0 = vaddpd_avx512f(auVar36,auVar40);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[1];
    auVar32 = vbroadcastsd_avx512f(auVar5);
    local_980 = vaddpd_avx512f(auVar31,auVar33);
    auVar31 = vmulpd_avx512f(local_180,auVar34);
    auVar33 = vmulpd_avx512f(local_2c0,auVar32);
    auVar36 = vmulpd_avx512f(local_280,auVar32);
    auVar32 = vmulpd_avx512f(local_240,auVar32);
    auVar33 = vaddpd_avx512f(auVar33,auVar41);
    auVar37 = vmulpd_avx512f(local_c0,auVar35);
    auVar33 = vaddpd_avx512f(auVar33,auVar42);
    auVar34 = vmulpd_avx512f(local_1c0,auVar34);
    local_8c0[0] = (assign_op<double,_double>)auVar33[0];
    local_8c0[1] = (assign_op<double,_double>)auVar33[1];
    local_8c0[2] = (assign_op<double,_double>)auVar33[2];
    local_8c0[3] = (assign_op<double,_double>)auVar33[3];
    local_8c0[4] = (assign_op<double,_double>)auVar33[4];
    local_8c0[5] = (assign_op<double,_double>)auVar33[5];
    local_8c0[6] = (assign_op<double,_double>)auVar33[6];
    local_8c0[7] = (assign_op<double,_double>)auVar33[7];
    local_8c0[8] = (assign_op<double,_double>)auVar33[8];
    local_8c0[9] = (assign_op<double,_double>)auVar33[9];
    local_8c0[10] = (assign_op<double,_double>)auVar33[10];
    local_8c0[0xb] = (assign_op<double,_double>)auVar33[0xb];
    local_8c0[0xc] = (assign_op<double,_double>)auVar33[0xc];
    local_8c0[0xd] = (assign_op<double,_double>)auVar33[0xd];
    local_8c0[0xe] = (assign_op<double,_double>)auVar33[0xe];
    local_8c0[0xf] = (assign_op<double,_double>)auVar33[0xf];
    local_8c0[0x10] = (assign_op<double,_double>)auVar33[0x10];
    local_8c0[0x11] = (assign_op<double,_double>)auVar33[0x11];
    local_8c0[0x12] = (assign_op<double,_double>)auVar33[0x12];
    local_8c0[0x13] = (assign_op<double,_double>)auVar33[0x13];
    local_8c0[0x14] = (assign_op<double,_double>)auVar33[0x14];
    local_8c0[0x15] = (assign_op<double,_double>)auVar33[0x15];
    local_8c0[0x16] = (assign_op<double,_double>)auVar33[0x16];
    local_8c0[0x17] = (assign_op<double,_double>)auVar33[0x17];
    local_8c0[0x18] = (assign_op<double,_double>)auVar33[0x18];
    local_8c0[0x19] = (assign_op<double,_double>)auVar33[0x19];
    local_8c0[0x1a] = (assign_op<double,_double>)auVar33[0x1a];
    local_8c0[0x1b] = (assign_op<double,_double>)auVar33[0x1b];
    local_8c0[0x1c] = (assign_op<double,_double>)auVar33[0x1c];
    local_8c0[0x1d] = (assign_op<double,_double>)auVar33[0x1d];
    local_8c0[0x1e] = (assign_op<double,_double>)auVar33[0x1e];
    local_8c0[0x1f] = (assign_op<double,_double>)auVar33[0x1f];
    local_8c0[0x20] = (assign_op<double,_double>)auVar33[0x20];
    local_8c0[0x21] = (assign_op<double,_double>)auVar33[0x21];
    local_8c0[0x22] = (assign_op<double,_double>)auVar33[0x22];
    local_8c0[0x23] = (assign_op<double,_double>)auVar33[0x23];
    local_8c0[0x24] = (assign_op<double,_double>)auVar33[0x24];
    local_8c0[0x25] = (assign_op<double,_double>)auVar33[0x25];
    local_8c0[0x26] = (assign_op<double,_double>)auVar33[0x26];
    local_8c0[0x27] = (assign_op<double,_double>)auVar33[0x27];
    local_8c0[0x28] = (assign_op<double,_double>)auVar33[0x28];
    local_8c0[0x29] = (assign_op<double,_double>)auVar33[0x29];
    local_8c0[0x2a] = (assign_op<double,_double>)auVar33[0x2a];
    local_8c0[0x2b] = (assign_op<double,_double>)auVar33[0x2b];
    local_8c0[0x2c] = (assign_op<double,_double>)auVar33[0x2c];
    local_8c0[0x2d] = (assign_op<double,_double>)auVar33[0x2d];
    local_8c0[0x2e] = (assign_op<double,_double>)auVar33[0x2e];
    local_8c0[0x2f] = (assign_op<double,_double>)auVar33[0x2f];
    local_8c0[0x30] = (assign_op<double,_double>)auVar33[0x30];
    local_8c0[0x31] = (assign_op<double,_double>)auVar33[0x31];
    local_8c0[0x32] = (assign_op<double,_double>)auVar33[0x32];
    local_8c0[0x33] = (assign_op<double,_double>)auVar33[0x33];
    local_8c0[0x34] = (assign_op<double,_double>)auVar33[0x34];
    local_8c0[0x35] = (assign_op<double,_double>)auVar33[0x35];
    local_8c0[0x36] = (assign_op<double,_double>)auVar33[0x36];
    local_8c0[0x37] = (assign_op<double,_double>)auVar33[0x37];
    local_8c0[0x38] = (assign_op<double,_double>)auVar33[0x38];
    local_8c0[0x39] = (assign_op<double,_double>)auVar33[0x39];
    local_8c0[0x3a] = (assign_op<double,_double>)auVar33[0x3a];
    local_8c0[0x3b] = (assign_op<double,_double>)auVar33[0x3b];
    local_8c0[0x3c] = (assign_op<double,_double>)auVar33[0x3c];
    local_8c0[0x3d] = (assign_op<double,_double>)auVar33[0x3d];
    local_8c0[0x3e] = (assign_op<double,_double>)auVar33[0x3e];
    local_8c0[0x3f] = (assign_op<double,_double>)auVar33[0x3f];
    auVar33 = vaddpd_avx512f(auVar36,auVar34);
    auVar34 = vmulpd_avx512f(local_100,auVar35);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2];
    auVar35 = vbroadcastsd_avx512f(auVar6);
    local_880 = vaddpd_avx512f(auVar33,auVar34);
    auVar31 = vaddpd_avx512f(auVar32,auVar31);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar32 = vbroadcastsd_avx512f(auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_910.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar33 = vbroadcastsd_avx512f(auVar8);
    local_840 = vaddpd_avx512f(auVar31,auVar37);
    auVar31 = vmulpd_avx512f(local_240,auVar35);
    auVar34 = vmulpd_avx512f(local_2c0,auVar35);
    auVar36 = vmulpd_avx512f(local_200,auVar32);
    auVar37 = vmulpd_avx512f(local_140,auVar33);
    auVar38 = vmulpd_avx512f(local_c0,auVar33);
    auVar34 = vaddpd_avx512f(auVar34,auVar36);
    auVar35 = vmulpd_avx512f(local_280,auVar35);
    auVar36 = vmulpd_avx512f(local_180,auVar32);
    local_ac0 = vaddpd_avx512f(auVar34,auVar37);
    auVar32 = vmulpd_avx512f(local_1c0,auVar32);
    auVar31 = vaddpd_avx512f(auVar31,auVar36);
    auVar32 = vaddpd_avx512f(auVar35,auVar32);
    auVar33 = vmulpd_avx512f(local_100,auVar33);
    local_a40 = vaddpd_avx512f(auVar31,auVar38);
    local_a80 = vaddpd_avx512f(auVar32,auVar33);
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar25 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar26 = 2;
      lVar27 = 0;
      pdVar11 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar23 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      auVar12._8_8_ = 0x3fe0000000000000;
      auVar12._0_8_ = 0x3fe0000000000000;
      auVar28 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar25 + 3),auVar12);
      dVar10 = pdVar25[5] * 0.5;
      auVar29 = vshufpd_avx(auVar28,auVar28,1);
      while ((long)(uVar26 - 2) < (long)uVar23) {
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(double *)(local_8c0 + lVar27);
        dVar1 = *(double *)(local_ac0 + lVar27);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar1;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(double *)(local_8c0 + lVar27) * -dVar10;
        auVar30 = vfmadd231sd_fma(auVar50,auVar29,auVar47);
        pdVar11[uVar26 - 2] = auVar30._0_8_ + pdVar11[uVar26 - 2];
        if (uVar23 <= uVar26 - 1) break;
        dVar2 = *(double *)(local_a00 + lVar27);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar2;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = dVar10;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = dVar1 * -auVar28._0_8_;
        auVar30 = vfmadd231sd_fma(auVar48,auVar43,auVar51);
        pdVar11[uVar26 - 1] = auVar30._0_8_ + pdVar11[uVar26 - 1];
        if (uVar23 <= uVar26) break;
        lVar27 = lVar27 + 8;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = dVar2 * -auVar29._0_8_;
        auVar30 = vfmadd213sd_fma(auVar46,auVar28,auVar49);
        pdVar11[uVar26] = auVar30._0_8_ + pdVar11[uVar26];
        uVar26 = uVar26 + 3;
        if (uVar26 == 0x4a) {
          auVar20._8_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          auVar20._0_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          auVar21._8_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[8];
          auVar21._0_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7];
          auVar13._8_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6];
          auVar13._0_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6];
          auVar29 = vmulpd_avx512vl(auVar20,auVar13);
          auVar14._8_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar14._0_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar30 = vfmsub231pd_avx512vl(auVar29,auVar21,auVar14);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[8];
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7] *
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          auVar28 = vfmsub132sd_fma(auVar20,auVar45,auVar9);
          auVar19._8_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[2];
          auVar19._0_8_ =
               local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[1];
          auVar29 = vpermilpd_avx(auVar19,1);
          auVar44._0_8_ = auVar29._0_8_ * auVar30._0_8_;
          auVar44._8_8_ = auVar29._8_8_ * auVar30._8_8_;
          auVar29 = vshufpd_avx(auVar44,auVar44,1);
          *detJ = auVar44._0_8_ +
                  (auVar28._0_8_ *
                   local_b40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[0] - auVar29._0_8_);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementShellANCF_3833::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}